

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

void __thiscall
testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<RenderTest>::TestInfo>::
depart(linked_ptr<testing::internal::ParameterizedTestCaseInfo<RenderTest>::TestInfo> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestInfo *pTVar2;
  pointer pcVar3;
  bool bVar4;
  
  bVar4 = linked_ptr_internal::depart(&this->link_);
  if ((bVar4) && (pTVar2 = this->value_, pTVar2 != (TestInfo *)0x0)) {
    scoped_ptr<testing::internal::TestMetaFactoryBase<TestIntegrator>_>::reset
              (&pTVar2->test_meta_factory,(TestMetaFactoryBase<TestIntegrator> *)0x0);
    pcVar3 = (pTVar2->test_base_name)._M_dataplus._M_p;
    paVar1 = &(pTVar2->test_base_name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    pcVar3 = (pTVar2->test_case_base_name)._M_dataplus._M_p;
    paVar1 = &(pTVar2->test_case_base_name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pTVar2,0x48);
    return;
  }
  return;
}

Assistant:

void depart() {
    if (link_.depart()) delete value_;
  }